

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O0

void duckdb_zstd::HUF_simpleQuickSort(nodeElt *arr,int low,int high)

{
  nodeElt nVar1;
  int high_00;
  int in_EDX;
  int in_ESI;
  nodeElt *in_RDI;
  bool bVar2;
  int idx;
  int kInsertionSortThreshold;
  int j;
  nodeElt key;
  int size;
  int i;
  int iVar3;
  int local_24;
  uint local_20;
  int local_14;
  
  iVar3 = 8;
  if (in_EDX - in_ESI < 8) {
    for (local_14 = 1; local_14 < (in_EDX - in_ESI) + 1; local_14 = local_14 + 1) {
      nVar1 = in_RDI[(long)in_ESI + (long)local_14];
      iVar3 = local_14;
      while( true ) {
        local_24 = iVar3 + -1;
        bVar2 = false;
        if (-1 < local_24) {
          local_20 = nVar1.count;
          bVar2 = in_RDI[(long)in_ESI + (long)local_24].count < local_20;
        }
        if (!bVar2) break;
        in_RDI[(long)in_ESI + (long)iVar3] = in_RDI[(long)in_ESI + (long)local_24];
        iVar3 = local_24;
      }
      in_RDI[(long)in_ESI + (long)iVar3] = nVar1;
    }
  }
  else {
    while (in_ESI < in_EDX) {
      high_00 = HUF_quickSortPartition(in_RDI,in_ESI,in_EDX);
      if (high_00 - in_ESI < in_EDX - high_00) {
        HUF_simpleQuickSort((nodeElt *)CONCAT44(in_ESI,in_EDX),iVar3,high_00);
        in_ESI = high_00 + 1;
      }
      else {
        HUF_simpleQuickSort((nodeElt *)CONCAT44(in_ESI,in_EDX),iVar3,high_00);
        in_EDX = high_00 + -1;
      }
    }
  }
  return;
}

Assistant:

static void HUF_simpleQuickSort(nodeElt arr[], int low, int high) {
    int const kInsertionSortThreshold = 8;
    if (high - low < kInsertionSortThreshold) {
        HUF_insertionSort(arr, low, high);
        return;
    }
    while (low < high) {
        int const idx = HUF_quickSortPartition(arr, low, high);
        if (idx - low < high - idx) {
            HUF_simpleQuickSort(arr, low, idx - 1);
            low = idx + 1;
        } else {
            HUF_simpleQuickSort(arr, idx + 1, high);
            high = idx - 1;
        }
    }
}